

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getparam.c
# Opt level: O0

LongShort * findshortopt(char letter)

{
  uint local_18;
  uchar l;
  uint j;
  char letter_local;
  
  if ((letter < '\x7f') && (' ' < letter)) {
    if (!findshortopt::singles_done) {
      for (local_18 = 0; local_18 < 0x113; local_18 = local_18 + 1) {
        if (aliases[local_18].letter != ' ') {
          findshortopt::singles[(int)((byte)aliases[local_18].letter - 0x20)] = aliases + local_18;
        }
      }
      findshortopt::singles_done = true;
    }
    _j = findshortopt::singles[letter + -0x20];
  }
  else {
    _j = (LongShort *)0x0;
  }
  return _j;
}

Assistant:

const struct LongShort *findshortopt(char letter)
{
  static const struct LongShort *singles[128 - ' ']; /* ASCII => pointer */
  static bool singles_done = FALSE;
  if((letter >= 127) || (letter <= ' '))
    return NULL;

  if(!singles_done) {
    unsigned int j;
    for(j = 0; j < CURL_ARRAYSIZE(aliases); j++) {
      if(aliases[j].letter != ' ') {
        unsigned char l = (unsigned char)aliases[j].letter;
        singles[l - ' '] = &aliases[j];
      }
    }
    singles_done = TRUE;
  }
  return singles[letter - ' '];
}